

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_colorf_hsva_f(float *out_h,float *out_s,float *out_v,float *out_a,nk_colorf in)

{
  bool bVar1;
  float fVar2;
  undefined8 uVar3;
  undefined4 local_54;
  undefined4 local_50;
  float t_1;
  float t;
  float K;
  float chroma;
  float *out_a_local;
  float *out_v_local;
  float *out_s_local;
  float *out_h_local;
  nk_colorf in_local;
  
  t_1 = 0.0;
  out_h_local._4_4_ = in.g;
  fVar2 = out_h_local._4_4_;
  in_local.r = in.b;
  bVar1 = out_h_local._4_4_ < in_local.r;
  out_h_local = in._0_8_;
  uVar3 = in._8_8_;
  if (bVar1) {
    out_h_local._0_4_ = in.r;
    out_h_local = (float *)CONCAT44(in_local.r,out_h_local._0_4_);
    in_local.g = in.a;
    in_local.r = fVar2;
    t_1 = -1.0;
    uVar3 = in_local._0_8_;
  }
  in_local._0_8_ = uVar3;
  if (out_h_local._0_4_ < out_h_local._4_4_) {
    out_h_local = (float *)CONCAT44(out_h_local._0_4_,out_h_local._4_4_);
    t_1 = -0.33333334 - t_1;
  }
  if (in_local.r <= out_h_local._4_4_) {
    local_50 = in_local.r;
  }
  else {
    local_50 = out_h_local._4_4_;
  }
  local_50 = out_h_local._0_4_ - local_50;
  if (0.0 <= t_1 + (out_h_local._4_4_ - in_local.r) / (local_50 * 6.0 + 1e-20)) {
    local_54 = t_1 + (out_h_local._4_4_ - in_local.r) / (local_50 * 6.0 + 1e-20);
  }
  else {
    local_54 = -(t_1 + (out_h_local._4_4_ - in_local.r) / (local_50 * 6.0 + 1e-20));
  }
  *out_h = local_54;
  *out_s = local_50 / (out_h_local._0_4_ + 1e-20);
  *out_v = out_h_local._0_4_;
  *out_a = in_local.g;
  return;
}

Assistant:

NK_API void
nk_colorf_hsva_f(float *out_h, float *out_s,
    float *out_v, float *out_a, struct nk_colorf in)
{
    float chroma;
    float K = 0.0f;
    if (in.g < in.b) {
        const float t = in.g; in.g = in.b; in.b = t;
        K = -1.f;
    }
    if (in.r < in.g) {
        const float t = in.r; in.r = in.g; in.g = t;
        K = -2.f/6.0f - K;
    }
    chroma = in.r - ((in.g < in.b) ? in.g: in.b);
    *out_h = NK_ABS(K + (in.g - in.b)/(6.0f * chroma + 1e-20f));
    *out_s = chroma / (in.r + 1e-20f);
    *out_v = in.r;
    *out_a = in.a;

}